

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::GetNearPlane(ON_Viewport *this,ON_Plane *near_plane)

{
  double dVar1;
  bool bVar2;
  ON_3dVector OStack_58;
  ON_3dPoint local_40;
  
  if (this->m_bValidFrustum != true) {
    return false;
  }
  bVar2 = this->m_bValidCamera == true;
  if (bVar2) {
    ::operator*(&OStack_58,this->m_frus_near,&this->m_CamZ);
    ON_3dPoint::operator-(&local_40,&this->m_CamLoc,&OStack_58);
    (near_plane->origin).z = local_40.z;
    (near_plane->origin).x = local_40.x;
    (near_plane->origin).y = local_40.y;
    (near_plane->xaxis).z = (this->m_CamX).z;
    dVar1 = (this->m_CamX).y;
    (near_plane->xaxis).x = (this->m_CamX).x;
    (near_plane->xaxis).y = dVar1;
    dVar1 = (this->m_CamY).y;
    (near_plane->yaxis).x = (this->m_CamY).x;
    (near_plane->yaxis).y = dVar1;
    (near_plane->yaxis).z = (this->m_CamY).z;
    dVar1 = (this->m_CamZ).y;
    (near_plane->zaxis).x = (this->m_CamZ).x;
    (near_plane->zaxis).y = dVar1;
    (near_plane->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(near_plane);
  }
  return bVar2;
}

Assistant:

bool ON_Viewport::GetNearPlane( ON_Plane& near_plane ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    near_plane.origin = m_CamLoc - m_frus_near*m_CamZ;
    near_plane.xaxis = m_CamX;
    near_plane.yaxis = m_CamY;
    near_plane.zaxis = m_CamZ;
    near_plane.UpdateEquation();
  }
  return rc;
}